

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

bool Assimp::IFC::ProcessPolyloop(IfcPolyLoop *loop,TempMesh *meshout,ConversionData *param_3)

{
  bool bVar1;
  undefined1 *this;
  Lazy *this_00;
  reference pvVar2;
  value_type_conflict4 local_6c;
  undefined1 local_68 [8];
  IfcVector3 tmp;
  IfcCartesianPoint *c;
  const_iterator __end2;
  const_iterator __begin2;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *__range2;
  size_t cnt;
  ConversionData *param_2_local;
  TempMesh *meshout_local;
  IfcPolyLoop *loop_local;
  
  __range2 = (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *)0x0
  ;
  this = &(loop->super_IfcLoop).field_0x40;
  __end2 = std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                    *)this);
  c = (IfcCartesianPoint *)
      std::
      vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
      ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
             *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
                                *)&c);
    if (!bVar1) break;
    this_00 = (Lazy *)__gnu_cxx::
                      __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
                      ::operator*(&__end2);
    tmp.z = (double)STEP::Lazy::operator_cast_to_IfcCartesianPoint_(this_00);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_68);
    ConvertCartesianPoint((IfcVector3 *)local_68,(IfcCartesianPoint *)tmp.z);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              (&meshout->mVerts,(value_type *)local_68);
    __range2 = (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_3UL,_0UL> *)
               ((long)&(__range2->
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                       ).
                       super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
    ::operator++(&__end2);
  }
  local_6c = (value_type_conflict4)__range2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&meshout->mVertcnt,&local_6c);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&meshout->mVertcnt);
  if (*pvVar2 < 2) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&meshout->mVertcnt);
    if (*pvVar2 == 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&meshout->mVertcnt);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                (&meshout->mVerts);
    }
    loop_local._7_1_ = false;
  }
  else {
    loop_local._7_1_ = true;
  }
  return loop_local._7_1_;
}

Assistant:

bool ProcessPolyloop(const Schema_2x3::IfcPolyLoop& loop, TempMesh& meshout, ConversionData& /*conv*/)
{
    size_t cnt = 0;
    for(const Schema_2x3::IfcCartesianPoint& c : loop.Polygon) {
        IfcVector3 tmp;
        ConvertCartesianPoint(tmp,c);

        meshout.mVerts.push_back(tmp);
        ++cnt;
    }

    meshout.mVertcnt.push_back(static_cast<unsigned int>(cnt));

    // zero- or one- vertex polyloops simply ignored
    if (meshout.mVertcnt.back() > 1) {
        return true;
    }

    if (meshout.mVertcnt.back()==1) {
        meshout.mVertcnt.pop_back();
        meshout.mVerts.pop_back();
    }
    return false;
}